

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool duckdb_je_ckh_iter(ckh_t *ckh,size_t *tabind,void **key,void **data)

{
  void *pvVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = *tabind;
  bVar2 = (char)ckh->lg_curbuckets + 2;
  if (uVar3 >> (bVar2 & 0x3f) != 0) {
    return true;
  }
  lVar4 = uVar3 << 4;
  do {
    uVar3 = uVar3 + 1;
    pvVar1 = *(void **)((long)&ckh->tab->key + lVar4);
    if (pvVar1 != (void *)0x0) {
      if (key != (void **)0x0) {
        *key = pvVar1;
      }
      if (data != (void **)0x0) {
        *data = *(void **)((long)&ckh->tab->data + lVar4);
      }
      *tabind = uVar3;
      return false;
    }
    lVar4 = lVar4 + 0x10;
  } while (uVar3 >> (bVar2 & 0x3f) == 0);
  return true;
}

Assistant:

bool
ckh_iter(ckh_t *ckh, size_t *tabind, void **key, void **data) {
	size_t i, ncells;

	for (i = *tabind, ncells = (ZU(1) << (ckh->lg_curbuckets +
	    LG_CKH_BUCKET_CELLS)); i < ncells; i++) {
		if (ckh->tab[i].key != NULL) {
			if (key != NULL) {
				*key = (void *)ckh->tab[i].key;
			}
			if (data != NULL) {
				*data = (void *)ckh->tab[i].data;
			}
			*tabind = i + 1;
			return false;
		}
	}

	return true;
}